

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

FFont * FFont::FindFont(char *name)

{
  FFont **ppFVar1;
  int iVar2;
  FFont *pFVar3;
  
  pFVar3 = FirstFont;
  if (FirstFont != (FFont *)0x0 && name != (char *)0x0) {
    do {
      iVar2 = strcasecmp(pFVar3->Name,name);
      if (iVar2 == 0) {
        return pFVar3;
      }
      ppFVar1 = &pFVar3->Next;
      pFVar3 = *ppFVar1;
    } while (*ppFVar1 != (FFont *)0x0);
  }
  return (FFont *)0x0;
}

Assistant:

FFont *FFont::FindFont (const char *name)
{
	if (name == NULL)
	{
		return NULL;
	}
	FFont *font = FirstFont;

	while (font != NULL)
	{
		if (stricmp (font->Name, name) == 0)
			break;
		font = font->Next;
	}
	return font;
}